

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_skein.c
# Opt level: O2

void xmr_skein(SkeinBitSequence *data,SkeinBitSequence *hashval)

{
  hashState_conflict state;
  Skein_512_Ctxt_t local_b0;
  
  local_b0.h.hashBitLen = 0x100;
  local_b0.X[0] = 0xccd044a12fdb3e13;
  local_b0.X[1] = 0xe83590301a79a9eb;
  local_b0.X[2] = 0x55aea0614f816e6f;
  local_b0.X[3] = 0x2a2767a4ae9b94db;
  local_b0.X[4] = 0xec06025e74dd7683;
  local_b0.X[5] = 0xe7a436cdc4746251;
  local_b0.X[6] = 0xc36fbaf9393ad185;
  local_b0.X[7] = 0x3eedba1833edfc13;
  local_b0.h.T[1] = 0x7000000000000000;
  local_b0.h.bCnt = 0;
  local_b0.h.T[0] = 0;
  Skein_512_Update(&local_b0,data,200);
  Skein_512_Final(&local_b0,hashval);
  return;
}

Assistant:

void xmr_skein(const SkeinBitSequence *data, SkeinBitSequence *hashval){
  #define XMR_HASHBITLEN 256
  #define XMR_DATABITLEN 1600

  // Init
  hashState  state;
  state.statebits = 64*SKEIN_512_STATE_WORDS;

  // Skein_512_Init(&state.u.ctx_512, (size_t)XMR_HASHBITLEN);
  state.u.ctx_512.h.hashBitLen = XMR_HASHBITLEN;
  memcpy(state.u.ctx_512.X,SKEIN_512_IV_256,sizeof(state.u.ctx_512.X));
  Skein_512_Ctxt_t* ctx = &(state.u.ctx_512);
  Skein_Start_New_Type(ctx,MSG);

  // Update
  if ((XMR_DATABITLEN & 7) == 0){  /* partial bytes? */
    Skein_512_Update(&state.u.ctx_512,data,XMR_DATABITLEN >> 3);
  }else{   /* handle partial final byte */
    size_t bCnt = (XMR_DATABITLEN >> 3) + 1;                  /* number of bytes to handle (nonzero here!) */
    u08b_t b,mask;

    mask = (u08b_t) (1u << (7 - (XMR_DATABITLEN & 7)));       /* partial byte bit mask */
    b    = (u08b_t) ((data[bCnt-1] & (0-mask)) | mask);   /* apply bit padding on final byte */

    Skein_512_Update(&state.u.ctx_512,data,bCnt-1); /* process all but the final byte    */
    Skein_512_Update(&state.u.ctx_512,&b  ,  1   ); /* process the (masked) partial byte */
    Skein_Set_Bit_Pad_Flag(state.u.h);                    /* set tweak flag for the final call */
  }

  // Finalize
  Skein_512_Final(&state.u.ctx_512, hashval);
}